

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O0

void __thiscall
vk::DebugReportRecorder::DebugReportRecorder
          (DebugReportRecorder *this,InstanceInterface *vki,VkInstance instance)

{
  RefData<vk::Handle<(vk::HandleType)29>_> data;
  Move<vk::Handle<(vk::HandleType)29>_> local_60;
  RefData<vk::Handle<(vk::HandleType)29>_> local_40;
  VkInstance local_20;
  VkInstance instance_local;
  InstanceInterface *vki_local;
  DebugReportRecorder *this_local;
  
  local_20 = instance;
  instance_local = (VkInstance)vki;
  vki_local = (InstanceInterface *)this;
  de::AppendList<vk::DebugReportMessage>::AppendList(&this->m_messages,0x400);
  vk::anon_unknown_0::createCallback
            (&local_60,(InstanceInterface *)instance_local,local_20,&this->m_messages);
  refdetails::Move::operator_cast_to_RefData(&local_40,(Move *)&local_60);
  data.deleter.m_instanceIface = local_40.deleter.m_instanceIface;
  data.object.m_internal = local_40.object.m_internal;
  data.deleter.m_instance = local_40.deleter.m_instance;
  data.deleter.m_allocator = local_40.deleter.m_allocator;
  refdetails::Unique<vk::Handle<(vk::HandleType)29>_>::Unique(&this->m_callback,data);
  refdetails::Move<vk::Handle<(vk::HandleType)29>_>::~Move(&local_60);
  return;
}

Assistant:

DebugReportRecorder::DebugReportRecorder (const InstanceInterface& vki, VkInstance instance)
	: m_messages	(1024)
	, m_callback	(createCallback(vki, instance, &m_messages))
{
}